

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O2

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound,long volume)

{
  if (sound != (AudioBackend_Sound *)0x0) {
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x127828);
    }
    SetSoundVolume(sound,volume);
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_unlock)(0x127828);
      return;
    }
  }
  return;
}

Assistant:

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound, long volume)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	SetSoundVolume(sound, volume);

	ma_mutex_unlock(&mutex);
}